

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

void __thiscall icu_63::CollationDataBuilder::clearContexts(CollationDataBuilder *this)

{
  ushort uVar1;
  UBool UVar2;
  ushort uVar3;
  uint32_t uVar4;
  void *pvVar5;
  UnicodeSetIterator iter;
  UnicodeSetIterator UStack_58;
  
  uVar1 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (this->contexts).fUnion.fStackFields.fLengthAndFlags = uVar3;
  UnicodeSetIterator::UnicodeSetIterator(&UStack_58,&this->contextChars);
  while( true ) {
    UVar2 = UnicodeSetIterator::next(&UStack_58);
    if (UVar2 == '\0') break;
    uVar4 = utrie2_get32_63(this->trie,UStack_58.codepoint);
    pvVar5 = UVector::elementAt(&this->conditionalCE32s,uVar4 >> 0xd);
    *(undefined4 *)((long)pvVar5 + 0x50) = 1;
  }
  UnicodeSetIterator::~UnicodeSetIterator(&UStack_58);
  return;
}

Assistant:

void
CollationDataBuilder::clearContexts() {
    contexts.remove();
    UnicodeSetIterator iter(contextChars);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        uint32_t ce32 = utrie2_get32(trie, iter.getCodepoint());
        U_ASSERT(isBuilderContextCE32(ce32));
        getConditionalCE32ForCE32(ce32)->builtCE32 = Collation::NO_CE32;
    }
}